

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.cpp
# Opt level: O3

Forms * __thiscall
curlpp::HttpPost::getList_abi_cxx11_(Forms *__return_storage_ptr__,HttpPost *this)

{
  size_t *psVar1;
  _Node *p_Var2;
  _List_node_base *p_Var3;
  
  (__return_storage_ptr__->
  super__List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
  )._M_impl._M_node._M_size = 0;
  for (p_Var3 = (this->mForms).
                super__List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var3 != (_List_node_base *)&this->mForms; p_Var3 = p_Var3->_M_next) {
    p_Var2 = std::__cxx11::
             list<utilspp::clone_ptr<curlpp::FormPart>,std::allocator<utilspp::clone_ptr<curlpp::FormPart>>>
             ::_M_create_node<utilspp::clone_ptr<curlpp::FormPart>const&>
                       ((list<utilspp::clone_ptr<curlpp::FormPart>,std::allocator<utilspp::clone_ptr<curlpp::FormPart>>>
                         *)__return_storage_ptr__,(clone_ptr<curlpp::FormPart> *)(p_Var3 + 1));
    std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
    psVar1 = &(__return_storage_ptr__->
              super__List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
              )._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

curlpp::Forms curlpp::HttpPost::getList()
{
  //I'm not sure cloning is absolutely necessary.
  Forms newForm;

  Forms::const_iterator pos;
  for(pos = mForms.begin(); pos != mForms.end(); pos++) 
    newForm.push_back(*pos);

  return newForm;
}